

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-attack.c
# Opt level: O2

wchar_t borg_launch_destroy_stuff(borg_grid *ag,wchar_t typ)

{
  wchar_t wVar1;
  object_kind *poVar2;
  
  if ((uint)(typ + L'\xfffffffc') < 4) {
    poVar2 = borg_takes[ag->take].kind;
    switch(typ) {
    default:
      if ((poVar2->tval == 10) && (poVar2->aware == false)) {
        return L'\x14';
      }
      break;
    case L'\x05':
      if (poVar2->tval == 0x15) {
        if (poVar2->aware != true) {
          return L'\x14';
        }
        if (poVar2->sval == sv_ring_speed) {
          return L'ߐ';
        }
      }
      break;
    case L'\a':
      if (poVar2->tval == 0x1a) {
        if ((((((poVar2->aware == true) && (wVar1 = poVar2->sval, wVar1 != sv_potion_healing)) &&
              (wVar1 != sv_potion_star_healing)) && (wVar1 != sv_potion_life)) &&
            (((wVar1 != sv_potion_inc_str || (!borg.need_statgain[0])) &&
             ((wVar1 != sv_potion_inc_int || (!borg.need_statgain[1])))))) &&
           (((wVar1 != sv_potion_inc_wis || (!borg.need_statgain[2])) &&
            ((wVar1 != sv_potion_inc_dex || (!borg.need_statgain[3])))))) {
          if (wVar1 != sv_potion_inc_con) {
            return L'\x14';
          }
          if (!borg.need_statgain[4]) {
            return L'\x14';
          }
        }
        return L'ߐ';
      }
    }
  }
  return L'\0';
}

Assistant:

static int borg_launch_destroy_stuff(borg_grid *ag, int typ)
{
    struct borg_take *take = &borg_takes[ag->take];
    struct object_kind *k_ptr = take->kind;

    switch (typ) {
    case BORG_ATTACK_ACID:
    {
        /* rings/boots cost extra (might be speed!) */
        if (k_ptr->tval == TV_BOOTS && !k_ptr->aware) {
            return 20;
        }
        break;
    }
    case BORG_ATTACK_ELEC:
    {
        /* rings/boots cost extra (might be speed!) */
        if (k_ptr->tval == TV_RING && !k_ptr->aware) {
            return 20;
        }
        if (k_ptr->tval == TV_RING
            && k_ptr->sval == sv_ring_speed) {
            return 2000;
        }
        break;
    }

    case BORG_ATTACK_FIRE:
    {
        /* rings/boots cost extra (might be speed!) */
        if (k_ptr->tval == TV_BOOTS && !k_ptr->aware) {
            return 20;
        }
        break;
    }
    case BORG_ATTACK_COLD:
    {
        if (k_ptr->tval == TV_POTION) {
            /* Extra penalty for cool potions */
            if (!k_ptr->aware || k_ptr->sval == sv_potion_healing
                || k_ptr->sval == sv_potion_star_healing
                || k_ptr->sval == sv_potion_life
                || (k_ptr->sval == sv_potion_inc_str
                    && borg.need_statgain[STAT_STR])
                || (k_ptr->sval == sv_potion_inc_int
                    && borg.need_statgain[STAT_INT])
                || (k_ptr->sval == sv_potion_inc_wis
                    && borg.need_statgain[STAT_WIS])
                || (k_ptr->sval == sv_potion_inc_dex
                    && borg.need_statgain[STAT_DEX])
                || (k_ptr->sval == sv_potion_inc_con
                    && borg.need_statgain[STAT_CON]))
                return 2000;

            return 20;

        }
        break;
    }
    case BORG_ATTACK_MANA:
    {
        /* Used against uniques, allow the stuff to burn */
        break;
    }
    }

    return 0;
}